

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::TestErrorHandler::handleClientProtocolError
          (TestErrorHandler *this,ProtocolError protocolError,Response *response)

{
  String *pSVar1;
  ArrayDisposer *in_RDX;
  String *in_R9;
  StringPtr statusText;
  Maybe<kj::HttpService::Response_&> local_a0;
  String local_98;
  StringPtr local_80 [2];
  ArrayPtr<const_char> local_60;
  String local_50;
  undefined1 local_38 [8];
  String message;
  Response *response_local;
  TestErrorHandler *this_local;
  
  message.content.disposer = in_RDX;
  local_60 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&protocolError.rawContent);
  encodeCEscape(&local_50,local_60);
  str<char_const(&)[21],kj::StringPtr&,char_const(&)[16],kj::String>
            ((String *)local_38,(kj *)"Saw protocol error: ",
             (char (*) [21])&protocolError.description,(StringPtr *)"; rawContent = ",
             (char (*) [16])&local_50,in_R9);
  String::~String(&local_50);
  StringPtr::StringPtr(local_80,"Bad Request");
  pSVar1 = mv<kj::String>((String *)local_38);
  String::String(&local_98,pSVar1);
  Maybe<kj::HttpService::Response_&>::Maybe(&local_a0,(Response *)message.content.disposer);
  statusText.content.size_ = (size_t)local_80[0].content.ptr;
  statusText.content.ptr = (char *)0x190;
  sendError(this,(uint)response,statusText,(String *)local_80[0].content.size_,
            (Maybe<kj::HttpService::Response_&> *)&local_98);
  String::~String(&local_98);
  String::~String((String *)local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> handleClientProtocolError(
      HttpHeaders::ProtocolError protocolError, kj::HttpService::Response& response) override {
    // In a real error handler, you should redact `protocolError.rawContent`.
    auto message = kj::str("Saw protocol error: ", protocolError.description, "; rawContent = ",
        encodeCEscape(protocolError.rawContent));
    return sendError(400, "Bad Request", kj::mv(message), response);
  }